

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall
Clone_variableWithUnitsPtrSet_Test::~Clone_variableWithUnitsPtrSet_Test
          (Clone_variableWithUnitsPtrSet_Test *this)

{
  Clone_variableWithUnitsPtrSet_Test *this_local;
  
  ~Clone_variableWithUnitsPtrSet_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Clone, variableWithUnitsPtrSet)
{
    auto u = libcellml::Units::create();
    u->setName("daves");

    auto v = libcellml::Variable::create();
    v->setUnits(u);

    auto vClone = v->clone();

    EXPECT_NE(v->units(), vClone->units());
    EXPECT_EQ(v->units()->name(), vClone->units()->name());
    EXPECT_EQ(nullptr, vClone->units()->parent());
}